

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::GLMClassifier::SerializeWithCachedSizes
          (GLMClassifier *this,CodedOutputStream *output)

{
  byte *pbVar1;
  Rep *pRVar2;
  bool bVar3;
  Type *value;
  int iVar4;
  byte *pbVar5;
  uint uVar6;
  int index;
  uint value_00;
  double *a;
  
  iVar4 = (this->weights_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar4 != 0) {
    index = 0;
    do {
      value = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::TypeHandler>
                        (&(this->weights_).super_RepeatedPtrFieldBase,index);
      google::protobuf::internal::WireFormatLite::WriteMessage(1,&value->super_MessageLite,output);
      index = index + 1;
    } while (iVar4 != index);
  }
  if (0 < (this->offset_).current_size_) {
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,0x12);
    }
    else {
      *output->buffer_ = '\x12';
      output->buffer_ = output->buffer_ + 1;
      output->buffer_size_ = output->buffer_size_ + -1;
    }
    value_00 = this->_offset_cached_byte_size_;
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,value_00);
    }
    else {
      pbVar1 = output->buffer_;
      pbVar5 = pbVar1;
      uVar6 = value_00;
      if (0x7f < value_00) {
        do {
          *pbVar5 = (byte)value_00 | 0x80;
          uVar6 = value_00 >> 7;
          pbVar5 = pbVar5 + 1;
          bVar3 = 0x3fff < value_00;
          value_00 = uVar6;
        } while (bVar3);
      }
      *pbVar5 = (byte)uVar6;
      iVar4 = ((int)pbVar5 - (int)pbVar1) + 1;
      output->buffer_ = output->buffer_ + iVar4;
      output->buffer_size_ = output->buffer_size_ - iVar4;
    }
    pRVar2 = (this->offset_).rep_;
    a = pRVar2->elements;
    if (pRVar2 == (Rep *)0x0) {
      a = (double *)0x0;
    }
    google::protobuf::internal::WireFormatLite::WriteDoubleArray
              (a,(this->offset_).current_size_,output);
  }
  if (this->postevaluationtransform_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteEnum(3,this->postevaluationtransform_,output);
  }
  if (this->classencoding_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteEnum(4,this->classencoding_,output);
  }
  if (this->_oneof_case_[0] == 100) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (100,&((this->ClassLabels_).stringclasslabels_)->super_MessageLite,output);
  }
  if (this->_oneof_case_[0] != 0x65) {
    return;
  }
  google::protobuf::internal::WireFormatLite::WriteMessage
            (0x65,&((this->ClassLabels_).stringclasslabels_)->super_MessageLite,output);
  return;
}

Assistant:

void GLMClassifier::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.GLMClassifier)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .CoreML.Specification.GLMClassifier.DoubleArray weights = 1;
  for (unsigned int i = 0, n = this->weights_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, this->weights(i), output);
  }

  // repeated double offset = 2;
  if (this->offset_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(2, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_offset_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteDoubleArray(
      this->offset().data(), this->offset_size(), output);
  }

  // .CoreML.Specification.GLMClassifier.PostEvaluationTransform postEvaluationTransform = 3;
  if (this->postevaluationtransform() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      3, this->postevaluationtransform(), output);
  }

  // .CoreML.Specification.GLMClassifier.ClassEncoding classEncoding = 4;
  if (this->classencoding() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      4, this->classencoding(), output);
  }

  // .CoreML.Specification.StringVector stringClassLabels = 100;
  if (has_stringclasslabels()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      100, *ClassLabels_.stringclasslabels_, output);
  }

  // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
  if (has_int64classlabels()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      101, *ClassLabels_.int64classlabels_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.GLMClassifier)
}